

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleFilter.cpp
# Opt level: O3

void __thiscall
Ptex::v2_4::PtexTriangleFilter::buildKernel
          (PtexTriangleFilter *this,PtexTriangleKernel *k,float u,float v,float uw1,float vw1,
          float uw2,float vw2,float width,float blur,Res faceRes)

{
  int iVar1;
  int iVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Dd;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  
  fVar6 = width * 0.25 * width;
  fVar8 = (vw1 * vw1 + vw2 * vw2) * fVar6;
  fVar3 = (uw1 * vw1 + uw2 * vw2) * fVar6 * -2.0;
  fVar12 = (fVar3 - fVar8) * 0.8660254;
  fVar11 = fVar8 * 0.75;
  fVar8 = fVar8 * 0.25 + fVar3 * -0.5 + (uw1 * uw1 + uw2 * uw2) * fVar6;
  fVar6 = SQRT(fVar12 * fVar12 + (fVar11 - fVar8) * (fVar11 - fVar8));
  fVar3 = (fVar6 * 1.0089285 - (fVar11 + fVar8)) * 0.5;
  fVar9 = 0.5 / (float)(1 << (faceRes.ulog2 & 0x1fU));
  fVar9 = fVar9 * fVar9;
  if (fVar3 <= fVar9) {
    fVar3 = fVar9;
  }
  fVar9 = blur * 0.25 * blur;
  if (fVar9 <= fVar3) {
    fVar9 = fVar3;
  }
  fVar11 = fVar11 + fVar9;
  fVar9 = fVar9 + fVar8;
  fVar3 = fVar11 * fVar9 + fVar12 * -0.25 * fVar12;
  fVar3 = (fVar3 + fVar3) / (fVar11 + fVar9 + fVar6);
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  iVar1 = 0x7f - ((uint)(fVar3 + fVar3) >> 0x17 & 0xff);
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  fVar11 = fVar11 * 1.3333334;
  fVar3 = fVar12 * 1.1547005 + fVar11;
  fVar6 = (fVar9 + fVar11 * -0.25 + fVar3 * 0.5) * 12.25;
  if (fVar6 < 0.0) {
    fVar8 = sqrtf(fVar6);
    uVar4 = extraout_XMM0_Dc;
    uVar5 = extraout_XMM0_Dd;
  }
  else {
    uVar4 = 0;
    uVar5 = 0;
    fVar8 = SQRT(fVar6);
  }
  fVar11 = fVar11 * 12.25;
  fVar3 = fVar3 * 12.25;
  if (fVar11 < 0.0) {
    fVar9 = sqrtf(fVar11);
  }
  else {
    fVar9 = SQRT(fVar11);
  }
  fVar7 = (1.0 - u) - v;
  fVar12 = (fVar11 - fVar3) + fVar6;
  if (fVar12 < 0.0) {
    fVar12 = sqrtf(fVar12);
  }
  else {
    fVar12 = SQRT(fVar12);
  }
  if (1.0 <= fVar12) {
    fVar12 = 1.0;
  }
  k->res = (Res)((short)(iVar2 << 8) + (short)iVar2);
  k->u = u;
  k->v = v;
  auVar10._4_4_ = fVar9;
  auVar10._0_4_ = fVar8;
  auVar10._8_4_ = uVar4;
  auVar10._12_4_ = uVar5;
  auVar10 = minps(auVar10,_DAT_0011c1a0);
  k->u1 = u - auVar10._0_4_;
  k->v1 = v - auVar10._4_4_;
  k->w1 = fVar7 - fVar12;
  k->u2 = auVar10._0_4_ + u;
  k->v2 = auVar10._4_4_ + v;
  k->w2 = fVar12 + fVar7;
  k->A = fVar11;
  k->B = fVar3;
  k->C = fVar6;
  return;
}

Assistant:

void PtexTriangleFilter::buildKernel(PtexTriangleKernel& k, float u, float v,
                                     float uw1, float vw1, float uw2, float vw2,
                                     float width, float blur, Res faceRes)
{
    const float sqrt3 = 1.7320508075688772f;

    // compute ellipse coefficients, A*u^2 + B*u*v + C*v^2 == AC - B^2/4
    float scaleAC = 0.25f * width*width;
    float scaleB = -2.0f * scaleAC;
    float A = (vw1*vw1 + vw2*vw2) * scaleAC;
    float B = (uw1*vw1 + uw2*vw2) * scaleB;
    float C = (uw1*uw1 + uw2*uw2) * scaleAC;

    // convert to cartesian domain
    float Ac = 0.75f * A;
    float Bc = float(sqrt3/2) * (B-A);
    float Cc = 0.25f * A - 0.5f * B + C;

    // compute min blur for eccentricity clamping
    const float maxEcc = 15.0f; // max eccentricity
    const float eccRatio = (maxEcc*maxEcc + 1.0f) / (maxEcc*maxEcc - 1.0f);
    float X = sqrtf(squared(Ac - Cc) + squared(Bc));
    float b_e = 0.5f * (eccRatio * X - (Ac + Cc));

    // compute min blur for texel clamping
    // (ensure that ellipse is no smaller than a texel)
    float b_t = squared(0.5f / (float)faceRes.u());

    // add blur
    float b_b = 0.25f * blur * blur;
    float b = PtexUtils::max(b_b, PtexUtils::max(b_e, b_t));
    Ac += b;
    Cc += b;

    // compute minor radius
    float m = sqrtf(2.0f*(Ac*Cc - 0.25f*Bc*Bc) / (Ac + Cc + X));

    // choose desired resolution
    int reslog2 = PtexUtils::max(0, PtexUtils::calcResFromWidth(2.0f*m));

    // convert back to triangular domain
    A = float(4/3.0) * Ac;
    B = float(2/sqrt3) * Bc + A;
    C = -0.25f * A + 0.5f * B + Cc;

    // scale by kernel width
    float scale = PtexTriangleKernelWidth * PtexTriangleKernelWidth;
    A *= scale;
    B *= scale;
    C *= scale;

    // find u,v,w extents
    float uw = PtexUtils::min(sqrtf(C), 1.0f);
    float vw = PtexUtils::min(sqrtf(A), 1.0f);
    float ww = PtexUtils::min(sqrtf(A-B+C), 1.0f);

    // init kernel
    float w = 1.0f - u - v;
    k.set(Res((int8_t)reslog2, (int8_t)reslog2), u, v, u-uw, v-vw, w-ww, u+uw, v+vw, w+ww, A, B, C);
}